

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O2

void transpose_16x8_to_8x16(uchar *src,int in_p,uchar *dst,int out_p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [12];
  unkbyte10 Var11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  long lVar17;
  undefined4 in_register_00000034;
  undefined2 uVar18;
  undefined4 uVar19;
  undefined4 uVar27;
  undefined1 auVar29 [16];
  undefined1 auVar38 [16];
  undefined1 auVar45 [16];
  undefined2 uVar50;
  undefined4 uVar51;
  undefined1 auVar59 [16];
  undefined2 uVar62;
  undefined2 uVar69;
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [12];
  undefined1 auVar92 [16];
  undefined6 uVar20;
  undefined8 uVar21;
  undefined1 auVar23 [12];
  undefined1 auVar22 [12];
  undefined1 auVar24 [14];
  undefined1 auVar26 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar28 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar48 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined6 uVar52;
  undefined8 uVar53;
  undefined1 auVar55 [12];
  undefined1 auVar54 [12];
  undefined1 auVar56 [14];
  undefined1 auVar58 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined4 uVar63;
  undefined6 uVar64;
  undefined8 uVar65;
  undefined1 auVar66 [12];
  undefined1 auVar67 [14];
  undefined1 auVar68 [16];
  undefined4 uVar70;
  undefined6 uVar71;
  undefined8 uVar72;
  undefined1 auVar73 [12];
  undefined1 auVar77 [16];
  undefined1 auVar74 [14];
  undefined1 auVar78 [16];
  undefined1 auVar75 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar89 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar90 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  
  auVar25 = *(undefined1 (*) [16])src;
  auVar1 = *(undefined1 (*) [16])(src + 0x20);
  auVar26 = *(undefined1 (*) [16])(src + 0x40);
  auVar2 = *(undefined1 (*) [16])(src + 0x60);
  auVar36._0_14_ = auVar25._0_14_;
  auVar36[0xe] = auVar25[7];
  auVar36[0xf] = src[0x17];
  auVar35._14_2_ = auVar36._14_2_;
  auVar35._0_13_ = auVar25._0_13_;
  auVar35[0xd] = src[0x16];
  auVar34._13_3_ = auVar35._13_3_;
  auVar34._0_12_ = auVar25._0_12_;
  auVar34[0xc] = auVar25[6];
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_11_ = auVar25._0_11_;
  auVar33[0xb] = src[0x15];
  auVar32._11_5_ = auVar33._11_5_;
  auVar32._0_10_ = auVar25._0_10_;
  auVar32[10] = auVar25[5];
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_9_ = auVar25._0_9_;
  auVar31[9] = src[0x14];
  auVar30._9_7_ = auVar31._9_7_;
  auVar30._0_8_ = auVar25._0_8_;
  auVar30[8] = auVar25[4];
  Var5 = CONCAT91(CONCAT81(auVar30._8_8_,src[0x13]),auVar25[3]);
  auVar4._2_10_ = Var5;
  auVar4[1] = src[0x12];
  auVar4[0] = auVar25[2];
  auVar3._2_12_ = auVar4;
  auVar3[1] = src[0x11];
  auVar3[0] = auVar25[1];
  auVar29._0_2_ = CONCAT11(src[0x10],auVar25[0]);
  auVar29._2_14_ = auVar3;
  uVar18 = CONCAT11(src[0x18],auVar25[8]);
  uVar19 = CONCAT13(src[0x19],CONCAT12(auVar25[9],uVar18));
  uVar20 = CONCAT15(src[0x1a],CONCAT14(auVar25[10],uVar19));
  uVar21 = CONCAT17(src[0x1b],CONCAT16(auVar25[0xb],uVar20));
  auVar22._0_10_ = CONCAT19(src[0x1c],CONCAT18(auVar25[0xc],uVar21));
  auVar22[10] = auVar25[0xd];
  auVar22[0xb] = src[0x1d];
  auVar24[0xc] = auVar25[0xe];
  auVar24._0_12_ = auVar22;
  auVar24[0xd] = src[0x1e];
  auVar25[0xe] = auVar25[0xf];
  auVar25._0_14_ = auVar24;
  auVar25[0xf] = src[0x1f];
  auVar44._0_14_ = auVar1._0_14_;
  auVar44[0xe] = auVar1[7];
  auVar44[0xf] = src[0x37];
  auVar43._14_2_ = auVar44._14_2_;
  auVar43._0_13_ = auVar1._0_13_;
  auVar43[0xd] = src[0x36];
  auVar42._13_3_ = auVar43._13_3_;
  auVar42._0_12_ = auVar1._0_12_;
  auVar42[0xc] = auVar1[6];
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_11_ = auVar1._0_11_;
  auVar41[0xb] = src[0x35];
  auVar40._11_5_ = auVar41._11_5_;
  auVar40._0_10_ = auVar1._0_10_;
  auVar40[10] = auVar1[5];
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_9_ = auVar1._0_9_;
  auVar39[9] = src[0x34];
  auVar38._9_7_ = auVar39._9_7_;
  auVar38._0_8_ = auVar1._0_8_;
  auVar38[8] = auVar1[4];
  Var8 = CONCAT91(CONCAT81(auVar38._8_8_,src[0x33]),auVar1[3]);
  auVar7._2_10_ = Var8;
  auVar7[1] = src[0x32];
  auVar7[0] = auVar1[2];
  auVar6._2_12_ = auVar7;
  auVar6[1] = src[0x31];
  auVar6[0] = auVar1[1];
  uVar69 = CONCAT11(src[0x38],auVar1[8]);
  uVar70 = CONCAT13(src[0x39],CONCAT12(auVar1[9],uVar69));
  uVar71 = CONCAT15(src[0x3a],CONCAT14(auVar1[10],uVar70));
  uVar72 = CONCAT17(src[0x3b],CONCAT16(auVar1[0xb],uVar71));
  auVar73._0_10_ = CONCAT19(src[0x3c],CONCAT18(auVar1[0xc],uVar72));
  auVar73[10] = auVar1[0xd];
  auVar73[0xb] = src[0x3d];
  auVar74[0xc] = auVar1[0xe];
  auVar74._0_12_ = auVar73;
  auVar74[0xd] = src[0x3e];
  auVar75[0xe] = auVar1[0xf];
  auVar75._0_14_ = auVar74;
  auVar75[0xf] = src[0x3f];
  auVar99._0_14_ = auVar26._0_14_;
  auVar99[0xe] = auVar26[7];
  auVar99[0xf] = src[0x57];
  auVar98._14_2_ = auVar99._14_2_;
  auVar98._0_13_ = auVar26._0_13_;
  auVar98[0xd] = src[0x56];
  auVar97._13_3_ = auVar98._13_3_;
  auVar97._0_12_ = auVar26._0_12_;
  auVar97[0xc] = auVar26[6];
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._0_11_ = auVar26._0_11_;
  auVar96[0xb] = src[0x55];
  auVar95._11_5_ = auVar96._11_5_;
  auVar95._0_10_ = auVar26._0_10_;
  auVar95[10] = auVar26[5];
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._0_9_ = auVar26._0_9_;
  auVar94[9] = src[0x54];
  auVar93._9_7_ = auVar94._9_7_;
  auVar93._0_8_ = auVar26._0_8_;
  auVar93[8] = auVar26[4];
  Var11 = CONCAT91(CONCAT81(auVar93._8_8_,src[0x53]),auVar26[3]);
  auVar10._2_10_ = Var11;
  auVar10[1] = src[0x52];
  auVar10[0] = auVar26[2];
  auVar9._2_12_ = auVar10;
  auVar9[1] = src[0x51];
  auVar9[0] = auVar26[1];
  auVar92._0_2_ = CONCAT11(src[0x50],auVar26[0]);
  auVar92._2_14_ = auVar9;
  uVar50 = CONCAT11(src[0x58],auVar26[8]);
  uVar51 = CONCAT13(src[0x59],CONCAT12(auVar26[9],uVar50));
  uVar52 = CONCAT15(src[0x5a],CONCAT14(auVar26[10],uVar51));
  uVar53 = CONCAT17(src[0x5b],CONCAT16(auVar26[0xb],uVar52));
  auVar54._0_10_ = CONCAT19(src[0x5c],CONCAT18(auVar26[0xc],uVar53));
  auVar54[10] = auVar26[0xd];
  auVar54[0xb] = src[0x5d];
  auVar56[0xc] = auVar26[0xe];
  auVar56._0_12_ = auVar54;
  auVar56[0xd] = src[0x5e];
  auVar57[0xe] = auVar26[0xf];
  auVar57._0_14_ = auVar56;
  auVar57[0xf] = src[0x5f];
  auVar85._0_14_ = auVar2._0_14_;
  auVar85[0xe] = auVar2[7];
  auVar85[0xf] = src[0x77];
  auVar84._14_2_ = auVar85._14_2_;
  auVar84._0_13_ = auVar2._0_13_;
  auVar84[0xd] = src[0x76];
  auVar83._13_3_ = auVar84._13_3_;
  auVar83._0_12_ = auVar2._0_12_;
  auVar83[0xc] = auVar2[6];
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._0_11_ = auVar2._0_11_;
  auVar82[0xb] = src[0x75];
  auVar81._11_5_ = auVar82._11_5_;
  auVar81._0_10_ = auVar2._0_10_;
  auVar81[10] = auVar2[5];
  auVar80._10_6_ = auVar81._10_6_;
  auVar80._0_9_ = auVar2._0_9_;
  auVar80[9] = src[0x74];
  auVar79._9_7_ = auVar80._9_7_;
  auVar79._0_8_ = auVar2._0_8_;
  auVar79[8] = auVar2[4];
  Var14 = CONCAT91(CONCAT81(auVar79._8_8_,src[0x73]),auVar2[3]);
  auVar13._2_10_ = Var14;
  auVar13[1] = src[0x72];
  auVar13[0] = auVar2[2];
  auVar12._2_12_ = auVar13;
  auVar12[1] = src[0x71];
  auVar12[0] = auVar2[1];
  uVar62 = CONCAT11(src[0x78],auVar2[8]);
  uVar63 = CONCAT13(src[0x79],CONCAT12(auVar2[9],uVar62));
  uVar64 = CONCAT15(src[0x7a],CONCAT14(auVar2[10],uVar63));
  uVar65 = CONCAT17(src[0x7b],CONCAT16(auVar2[0xb],uVar64));
  auVar66._0_10_ = CONCAT19(src[0x7c],CONCAT18(auVar2[0xc],uVar65));
  auVar66[10] = auVar2[0xd];
  auVar66[0xb] = src[0x7d];
  auVar67[0xc] = auVar2[0xe];
  auVar67._0_12_ = auVar66;
  auVar67[0xd] = src[0x7e];
  auVar68[0xe] = auVar2[0xf];
  auVar68._0_14_ = auVar67;
  auVar68[0xf] = src[0x7f];
  auVar61._0_12_ = auVar29._0_12_;
  auVar61._12_2_ = (short)Var5;
  auVar61._14_2_ = (short)Var8;
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = auVar29._0_10_;
  auVar60._10_2_ = auVar7._0_2_;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._0_8_ = auVar29._0_8_;
  auVar59._8_2_ = auVar4._0_2_;
  auVar15._4_8_ = auVar59._8_8_;
  auVar15._2_2_ = auVar6._0_2_;
  auVar15._0_2_ = auVar3._0_2_;
  uVar27 = CONCAT22(auVar38._8_2_,auVar30._8_2_);
  auVar28._0_8_ = CONCAT26(auVar40._10_2_,CONCAT24(auVar32._10_2_,uVar27));
  auVar28._8_2_ = auVar34._12_2_;
  auVar28._10_2_ = auVar42._12_2_;
  auVar37._12_2_ = auVar35._14_2_;
  auVar37._0_12_ = auVar28;
  auVar37._14_2_ = auVar43._14_2_;
  auVar49._12_2_ = (short)((ulong)uVar21 >> 0x30);
  auVar49._0_12_ = auVar22;
  auVar49._14_2_ = (short)((ulong)uVar72 >> 0x30);
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._10_2_ = (short)((uint6)uVar71 >> 0x20);
  auVar48._0_10_ = auVar22._0_10_;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._8_2_ = (short)((uint6)uVar20 >> 0x20);
  auVar47._0_8_ = uVar21;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = (short)((uint)uVar70 >> 0x10);
  auVar46._0_6_ = uVar20;
  auVar45._6_10_ = auVar46._6_10_;
  auVar45._4_2_ = (short)((uint)uVar19 >> 0x10);
  auVar45._0_4_ = uVar19;
  uVar19 = CONCAT22((short)((unkuint10)auVar73._0_10_ >> 0x40),
                    (short)((unkuint10)auVar22._0_10_ >> 0x40));
  auVar23._0_8_ = CONCAT26(auVar73._10_2_,CONCAT24(auVar22._10_2_,uVar19));
  auVar23._8_2_ = auVar24._12_2_;
  auVar23._10_2_ = auVar74._12_2_;
  auVar26._12_2_ = auVar25._14_2_;
  auVar26._0_12_ = auVar23;
  auVar26._14_2_ = auVar75._14_2_;
  auVar78._0_12_ = auVar92._0_12_;
  auVar78._12_2_ = (short)Var11;
  auVar78._14_2_ = (short)Var14;
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._0_10_ = auVar92._0_10_;
  auVar77._10_2_ = auVar13._0_2_;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._0_8_ = auVar92._0_8_;
  auVar76._8_2_ = auVar10._0_2_;
  auVar16._4_8_ = auVar76._8_8_;
  auVar16._2_2_ = auVar12._0_2_;
  auVar16._0_2_ = auVar9._0_2_;
  uVar70 = CONCAT22(auVar79._8_2_,auVar93._8_2_);
  auVar91._0_8_ = CONCAT26(auVar81._10_2_,CONCAT24(auVar95._10_2_,uVar70));
  auVar91._8_2_ = auVar97._12_2_;
  auVar91._10_2_ = auVar83._12_2_;
  auVar100._12_2_ = auVar98._14_2_;
  auVar100._0_12_ = auVar91;
  auVar100._14_2_ = auVar84._14_2_;
  auVar90._12_2_ = (short)((ulong)uVar53 >> 0x30);
  auVar90._0_12_ = auVar54;
  auVar90._14_2_ = (short)((ulong)uVar65 >> 0x30);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._10_2_ = (short)((uint6)uVar64 >> 0x20);
  auVar89._0_10_ = auVar54._0_10_;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = (short)((uint6)uVar52 >> 0x20);
  auVar88._0_8_ = uVar53;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = (short)((uint)uVar63 >> 0x10);
  auVar87._0_6_ = uVar52;
  auVar86._6_10_ = auVar87._6_10_;
  auVar86._4_2_ = (short)((uint)uVar51 >> 0x10);
  auVar86._0_4_ = uVar51;
  uVar51 = CONCAT22((short)((unkuint10)auVar66._0_10_ >> 0x40),
                    (short)((unkuint10)auVar54._0_10_ >> 0x40));
  auVar55._0_8_ = CONCAT26(auVar66._10_2_,CONCAT24(auVar54._10_2_,uVar51));
  auVar55._8_2_ = auVar56._12_2_;
  auVar55._10_2_ = auVar67._12_2_;
  auVar58._12_2_ = auVar57._14_2_;
  auVar58._0_12_ = auVar55;
  auVar58._14_2_ = auVar68._14_2_;
  *(ulong *)CONCAT44(in_register_00000034,in_p) =
       CONCAT44(CONCAT22(CONCAT11(src[0x70],auVar2[0]),auVar92._0_2_),
                CONCAT22(CONCAT11(src[0x30],auVar1[0]),auVar29._0_2_));
  lVar17 = (long)(int)dst;
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17) = CONCAT44(auVar16._0_4_,auVar15._0_4_);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 2) =
       CONCAT44(auVar76._8_4_,auVar59._8_4_);
  uVar21 = CONCAT44(auVar77._12_4_,auVar60._12_4_);
  *(undefined8 *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 3) = uVar21;
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 4) = CONCAT44(uVar70,uVar27);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 5) =
       CONCAT44((int)((ulong)auVar91._0_8_ >> 0x20),(int)((ulong)auVar28._0_8_ >> 0x20));
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 6) =
       CONCAT44(auVar91._8_4_,auVar28._8_4_);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 7) =
       CONCAT44(auVar100._12_4_,auVar37._12_4_);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 8) =
       CONCAT44(CONCAT22(uVar62,uVar50),CONCAT22(uVar69,uVar18));
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 9) =
       CONCAT44(auVar86._4_4_,auVar45._4_4_);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 10) =
       CONCAT44(auVar88._8_4_,auVar47._8_4_);
  uVar21 = CONCAT44(auVar89._12_4_,auVar48._12_4_);
  *(undefined8 *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 0xb) = uVar21;
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 0xc) = CONCAT44(uVar51,uVar19);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 0xd) =
       CONCAT44((int)((ulong)auVar55._0_8_ >> 0x20),(int)((ulong)auVar23._0_8_ >> 0x20));
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 0xe) =
       CONCAT44(auVar55._8_4_,auVar23._8_4_);
  *(ulong *)(CONCAT44(in_register_00000034,in_p) + lVar17 * 0xf) =
       CONCAT44(auVar58._12_4_,auVar26._12_4_);
  return;
}

Assistant:

static inline void transpose_16x8_to_8x16(unsigned char *src, int in_p,
                                          unsigned char *dst, int out_p) {
  // a0 b0 c0 d0 e0 f0 g0 h0 A0 B0 C0 D0 E0 F0 G0 H0
  // a1 b1 c1 d1 e1 f1 g1 h1 A1 B1 C1 D1 E1 F1 G1 H1
  // a2 b2 c2 d2 e2 f2 g2 h2 A2 B2 C2 D2 E2 F2 G2 H2
  // a3 b3 c3 d3 e3 f3 g3 h3 A3 B3 C3 D3 E3 F3 G3 H3
  // a4 b4 c4 d4 e4 f4 g4 h4 A4 B4 C4 D4 E4 F4 G4 H4
  // a5 b5 c5 d5 e5 f5 g5 h5 A5 B5 C5 D5 E5 F5 G5 H5
  // a6 b6 c6 d6 e6 f6 g6 h6 A6 B6 C6 D6 E6 F6 G6 H6
  // a7 b7 c7 d7 e7 f7 g7 h7 A7 B7 C7 D7 E7 F7 G7 H7
  const __m128i x0 = _mm_loadu_si128((__m128i *)(src));
  const __m128i x1 = _mm_loadu_si128((__m128i *)(src + (1 * in_p)));
  const __m128i x2 = _mm_loadu_si128((__m128i *)(src + (2 * in_p)));
  const __m128i x3 = _mm_loadu_si128((__m128i *)(src + (3 * in_p)));
  const __m128i x4 = _mm_loadu_si128((__m128i *)(src + (4 * in_p)));
  const __m128i x5 = _mm_loadu_si128((__m128i *)(src + (5 * in_p)));
  const __m128i x6 = _mm_loadu_si128((__m128i *)(src + (6 * in_p)));
  const __m128i x7 = _mm_loadu_si128((__m128i *)(src + (7 * in_p)));

  // a0 a1 b0 b1 c0 c1 d0 d1 A0 A1 B0 B1 C0 C1 D0 D1
  // e0 e1 f0 f1 g0 g1 h0 h1 E0 E1 F0 F1 G0 G1 H0 H1
  // a2 a3 b2 b3 c2 c3 d2 d3 A2 A3 B2 B3 C2 C3 D2 D3
  // e2 e3 f2 f3 g2 g3 h2 h3 E2 E3 F2 F3 G2 G3 H2 H3
  // a4 a5 b4 b5 c4 c5 d4 d5 A4 A5 B4 B5 C4 C5 D4 D5
  // e4 e5 f4 f5 g4 g5 h4 h5 E4 E5 F4 F5 G4 G5 H4 H5
  // a6 a7 b6 b7 c6 c7 d6 d7 A6 A7 B6 B7 C6 C7 D6 D7
  // e6 e7 f6 f7 g6 g7 h6 h7 E6 E7 F6 F7 G6 G7 H6 H7
  const __m128i x_s10 = _mm_unpacklo_epi8(x0, x1);
  const __m128i x_s11 = _mm_unpackhi_epi8(x0, x1);
  const __m128i x_s12 = _mm_unpacklo_epi8(x2, x3);
  const __m128i x_s13 = _mm_unpackhi_epi8(x2, x3);
  const __m128i x_s14 = _mm_unpacklo_epi8(x4, x5);
  const __m128i x_s15 = _mm_unpackhi_epi8(x4, x5);
  const __m128i x_s16 = _mm_unpacklo_epi8(x6, x7);
  const __m128i x_s17 = _mm_unpackhi_epi8(x6, x7);

  // a0 a1 a2 a3 b0 b1 b2 b3 | A0 A1 A2 A3 B0 B1 B2 B3
  // c0 c1 c2 c3 d0 d1 d2 d3 | C0 C1 C2 C3 D0 D1 D2 D3
  // e0 e1 e2 e3 f0 f1 f2 f3 | E0 E1 E2 E3 F0 F1 F2 F3
  // g0 g1 g2 g3 h0 h1 h2 h3 | G0 G1 G2 G3 H0 H1 H2 H3
  // a4 a5 a6 a7 b4 b5 b6 b7 | A4 A5 A6 A7 B4 B5 B6 B7
  // c4 c5 c6 c7 d4 d5 d6 d7 | C4 C5 C6 C7 D4 D5 D6 D7
  // e4 e5 e6 e7 f4 f5 f6 f7 | E4 E5 E6 E7 F4 F5 F6 F7
  // g4 g5 g6 g7 h4 h5 h6 h7 | G4 G5 G6 G7 H4 H5 H6 H7
  const __m128i x_s20 = _mm_unpacklo_epi16(x_s10, x_s12);
  const __m128i x_s21 = _mm_unpackhi_epi16(x_s10, x_s12);
  const __m128i x_s22 = _mm_unpacklo_epi16(x_s11, x_s13);
  const __m128i x_s23 = _mm_unpackhi_epi16(x_s11, x_s13);
  const __m128i x_s24 = _mm_unpacklo_epi16(x_s14, x_s16);
  const __m128i x_s25 = _mm_unpackhi_epi16(x_s14, x_s16);
  const __m128i x_s26 = _mm_unpacklo_epi16(x_s15, x_s17);
  const __m128i x_s27 = _mm_unpackhi_epi16(x_s15, x_s17);

  // a0 a1 a2 a3 a4 a5 a6 a7 | A0 A1 A2 A3 A4 A5 A6 A7
  // b0 b1 b2 b3 b4 b5 b6 b7 | B0 B1 B2 B3 B4 B5 B6 B7
  // c0 c1 c2 c3 c4 c5 c6 c7 | C0 C1 C2 C3 C4 C5 C6 C7
  // d0 d1 d2 d3 d4 d5 d6 d7 | D0 D1 D2 D3 D4 D5 D6 D7
  // e0 e1 e2 e3 e4 e5 e6 e7 | E0 E1 E2 E3 E4 E5 E6 E7
  // f0 f1 f2 f3 f4 f5 f6 f7 | F0 F1 F2 F3 F4 F5 F6 F7
  // g0 g1 g2 g3 g4 g5 g6 g7 | G0 G1 G2 G3 G4 G5 G6 G7
  // h0 h1 h2 h3 h4 h5 h6 h7 | H0 H1 H2 H3 H4 H5 H6 H7
  const __m128i x_s30 = _mm_unpacklo_epi32(x_s20, x_s24);
  const __m128i x_s31 = _mm_unpackhi_epi32(x_s20, x_s24);
  const __m128i x_s32 = _mm_unpacklo_epi32(x_s21, x_s25);
  const __m128i x_s33 = _mm_unpackhi_epi32(x_s21, x_s25);
  const __m128i x_s34 = _mm_unpacklo_epi32(x_s22, x_s26);
  const __m128i x_s35 = _mm_unpackhi_epi32(x_s22, x_s26);
  const __m128i x_s36 = _mm_unpacklo_epi32(x_s23, x_s27);
  const __m128i x_s37 = _mm_unpackhi_epi32(x_s23, x_s27);

  mm_storelu(dst, x_s30);
  mm_storehu(dst + (1 * out_p), x_s30);
  mm_storelu(dst + (2 * out_p), x_s31);
  mm_storehu(dst + (3 * out_p), x_s31);
  mm_storelu(dst + (4 * out_p), x_s32);
  mm_storehu(dst + (5 * out_p), x_s32);
  mm_storelu(dst + (6 * out_p), x_s33);
  mm_storehu(dst + (7 * out_p), x_s33);
  mm_storelu(dst + (8 * out_p), x_s34);
  mm_storehu(dst + (9 * out_p), x_s34);
  mm_storelu(dst + (10 * out_p), x_s35);
  mm_storehu(dst + (11 * out_p), x_s35);
  mm_storelu(dst + (12 * out_p), x_s36);
  mm_storehu(dst + (13 * out_p), x_s36);
  mm_storelu(dst + (14 * out_p), x_s37);
  mm_storehu(dst + (15 * out_p), x_s37);
}